

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

natwm_error event_handle_client_message(natwm_state *state,xcb_client_message_event_t *event)

{
  xcb_window_t window_00;
  natwm_error nVar1;
  uint32_t local_4c;
  xcb_ewmh_wm_state_action_t action;
  xcb_atom_t state_atom;
  uint32_t workspace_index_1;
  uint32_t workspace_index;
  xcb_window_t window;
  xcb_client_message_event_t *event_local;
  natwm_state *state_local;
  
  if (event->format == ' ') {
    window_00 = event->window;
    if (event->type == state->ewmh->_NET_ACTIVE_WINDOW) {
      state_local._4_4_ = client_focus_window(state,window_00);
    }
    else {
      if (event->type == state->ewmh->_NET_CLOSE_WINDOW) {
        xcb_destroy_window(state->xcb,window_00);
      }
      else {
        if (event->type == state->ewmh->_NET_CURRENT_DESKTOP) {
          nVar1 = workspace_list_switch_to_workspace(state,(ulong)(event->data).data32[0]);
          return nVar1;
        }
        if (event->type == state->ewmh->_NET_WM_DESKTOP) {
          nVar1 = client_send_window_to_workspace(state,window_00,(ulong)(event->data).data32[0]);
          return nVar1;
        }
        if (event->type == state->ewmh->_NET_WM_STATE) {
          if ((event->data).data32[1] == 0x40) {
            local_4c = (event->data).data32[2];
          }
          else {
            local_4c = (event->data).data32[1];
          }
          if (local_4c == state->ewmh->_NET_WM_STATE_FULLSCREEN) {
            nVar1 = client_handle_fullscreen_window(state,(event->data).data32[0],window_00);
            return nVar1;
          }
        }
      }
      state_local._4_4_ = NO_ERROR;
    }
  }
  else {
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

static enum natwm_error event_handle_client_message(struct natwm_state *state,
                                                    xcb_client_message_event_t *event)
{
        if (event->format != 32) {
                // We currently only support format 32
                return NO_ERROR;
        }

        xcb_window_t window = event->window;

        if (event->type == state->ewmh->_NET_ACTIVE_WINDOW) {
                return client_focus_window(state, window);
        } else if (event->type == state->ewmh->_NET_CLOSE_WINDOW) {
                xcb_destroy_window(state->xcb, window);
        } else if (event->type == state->ewmh->_NET_CURRENT_DESKTOP) {
                uint32_t workspace_index = event->data.data32[0];

                return workspace_list_switch_to_workspace(state, workspace_index);
        } else if (event->type == state->ewmh->_NET_WM_DESKTOP) {
                uint32_t workspace_index = event->data.data32[0];

                return client_send_window_to_workspace(state, window, workspace_index);
        } else if (event->type == state->ewmh->_NET_WM_STATE) {
                xcb_atom_t state_atom = (event->data.data32[1] != NO_ERROR) ? event->data.data32[1]
                                                                            : event->data.data32[2];
                xcb_ewmh_wm_state_action_t action = event->data.data32[0];

                if (state_atom == state->ewmh->_NET_WM_STATE_FULLSCREEN) {
                        return client_handle_fullscreen_window(state, action, window);
                }
        }

        return NO_ERROR;
}